

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O0

void cmSHA224_Final(sha_byte *digest,SHA_CTX *context)

{
  uint uVar1;
  int local_24;
  sha_word32 tmp;
  int j;
  sha_word32 *d;
  SHA_CTX *context_local;
  sha_byte *digest_local;
  
  if (context == (SHA_CTX *)0x0) {
    __assert_fail("context != (SHA_CTX*)0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cm_sha2.c"
                  ,0x480,"void cmSHA224_Final(sha_byte *, SHA_CTX *)");
  }
  if (digest != (sha_byte *)0x0) {
    cmSHA256_Internal_Last(context);
    _tmp = digest;
    for (local_24 = 0; local_24 < 7; local_24 = local_24 + 1) {
      uVar1 = *(uint *)((long)context + (long)local_24 * 4);
      uVar1 = uVar1 >> 0x10 | uVar1 << 0x10;
      *(uint *)((long)context + (long)local_24 * 4) =
           (uVar1 & 0xff00ff00) >> 8 | (uVar1 & 0xff00ff) << 8;
      *(undefined4 *)_tmp = *(undefined4 *)((long)context + (long)local_24 * 4);
      _tmp = _tmp + 4;
    }
  }
  memset(context,0,0xd0);
  return;
}

Assistant:

void SHA224_Final(sha_byte digest[], SHA_CTX* context) {
	sha_word32	*d = (sha_word32*)digest;

	/* Sanity check: */
	assert(context != (SHA_CTX*)0);

	/* If no digest buffer is passed, we don't bother doing this: */
	if (digest != (sha_byte*)0) {
		SHA256_Internal_Last(context);

		/* Save the hash data for output: */
#if BYTE_ORDER == LITTLE_ENDIAN
		{
			/* Convert TO host byte order */
			int	j;
			for (j = 0; j < (SHA224_DIGEST_LENGTH >> 2); j++) {
				REVERSE32(context->s256.state[j],context->s256.state[j]);
				*d++ = context->s256.state[j];
			}
		}
#else
		MEMCPY_BCOPY(d, context->s256.state, SHA224_DIGEST_LENGTH);
#endif
	}

	/* Clean up state data: */
	MEMSET_BZERO(context, sizeof(*context));
}